

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void check_move_buffer(char *str,
                      basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  allocator<char> *alloc;
  AssertHelper local_90;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  char *local_58;
  allocator<char> *local_50;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> local_48;
  
  local_50 = (buffer->super_allocator_ref<std::allocator<char>_>).alloc_;
  local_48.super_basic_buffer<char>.capacity_ = 0;
  local_48.super_allocator_ref<std::allocator<char>_>.alloc_ = (allocator<char> *)0x0;
  local_48.super_basic_buffer<char>.ptr_ = (char *)0x0;
  local_48.super_basic_buffer<char>.size_ = 0;
  local_48.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a85d8;
  local_58 = str;
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::move
            (&local_48,buffer);
  pcVar3 = (buffer->super_basic_buffer<char>).ptr_;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,pcVar3,pcVar3 + (buffer->super_basic_buffer<char>).size_);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&local_88,"str","std::string(&buffer[0], buffer.size())",&local_58,
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x124,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
      }
      local_78._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,local_48.super_basic_buffer<char>.ptr_,
             local_48.super_basic_buffer<char>.ptr_ + local_48.super_basic_buffer<char>.size_);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&local_88,"str","std::string(&buffer2[0], buffer2.size())",&local_58,
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_88.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x125,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
      }
      local_78._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90.data_._0_4_ = 5;
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_48.super_basic_buffer<char>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_78,"5u","buffer2.capacity()",(uint *)&local_90,
             (unsigned_long *)&local_88);
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (buffer->super_allocator_ref<std::allocator<char>_>).alloc_;
  local_90.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<std::allocator<char>*,std::allocator<char>*>
            ((internal *)&local_78,"nullptr","buffer.get_allocator().get()",
             (allocator<char> **)&local_90,(allocator<char> **)&local_88);
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x128,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_88.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_48.super_allocator_ref<std::allocator<char>_>.alloc_;
  testing::internal::CmpHelperEQ<std::allocator<char>*,std::allocator<char>*>
            ((internal *)&local_78,"alloc","buffer2.get_allocator().get()",&local_50,
             (allocator<char> **)&local_88);
  if ((char)local_78._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((undefined8 *)local_78._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_78._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
      local_88.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_002a85d8;
  if (local_48.super_basic_buffer<char>.ptr_ != local_48.store_) {
    operator_delete(local_48.super_basic_buffer<char>.ptr_);
  }
  return;
}

Assistant:

static void check_move_buffer(const char *str,
                       basic_memory_buffer<char, 5, TestAllocator> &buffer) {
  std::allocator<char> *alloc = buffer.get_allocator().get();
  basic_memory_buffer<char, 5, TestAllocator> buffer2(std::move(buffer));
  // Move shouldn't destroy the inline content of the first buffer.
  EXPECT_EQ(str, std::string(&buffer[0], buffer.size()));
  EXPECT_EQ(str, std::string(&buffer2[0], buffer2.size()));
  EXPECT_EQ(5u, buffer2.capacity());
  // Move should transfer allocator.
  EXPECT_EQ(FMT_NULL, buffer.get_allocator().get());
  EXPECT_EQ(alloc, buffer2.get_allocator().get());
}